

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

CLdispatchX * __thiscall CLIntercept::dispatchX(CLIntercept *this,cl_platform_id platform)

{
  const_iterator cVar1;
  CLdispatchX *pCVar2;
  key_type local_20;
  cl_platform_id local_18;
  
  local_18 = platform;
  cVar1 = std::
          _Rb_tree<_cl_platform_id_*,_std::pair<_cl_platform_id_*const,_CLdispatchX>,_std::_Select1st<std::pair<_cl_platform_id_*const,_CLdispatchX>_>,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
          ::find(&(this->m_DispatchX)._M_t,&local_18);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header) {
    local_20 = (key_type)0x0;
    pCVar2 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,&local_20);
  }
  else {
    pCVar2 = (CLdispatchX *)&cVar1._M_node[1]._M_parent;
  }
  return pCVar2;
}

Assistant:

inline const CLdispatchX& CLIntercept::dispatchX( cl_platform_id platform ) const
{
    CLdispatchXMap::const_iterator iter = m_DispatchX.find(platform);
    if( iter != m_DispatchX.end() )
    {
        return iter->second;
    }
    else
    {
        return m_DispatchX.at(NULL);
    }
}